

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultilineTextBox.cpp
# Opt level: O0

shared_ptr<gui::MultilineTextBoxStyle> __thiscall
gui::MultilineTextBox::getStyle(MultilineTextBox *this)

{
  element_type *__fn;
  int in_ECX;
  void *__child_stack;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  void *in_R8;
  shared_ptr<gui::MultilineTextBoxStyle> sVar1;
  element_type *this_00;
  
  this_00 = in_RDI;
  if ((*(byte *)(in_RSI + 0x2d0) & 1) == 0) {
    __fn = std::
           __shared_ptr_access<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25aefe);
    MultilineTextBoxStyle::clone
              ((MultilineTextBoxStyle *)&stack0xffffffffffffffe0,(__fn *)__fn,__child_stack,in_ECX,
               in_R8);
    std::shared_ptr<gui::MultilineTextBoxStyle>::operator=
              ((shared_ptr<gui::MultilineTextBoxStyle> *)this_00,
               (shared_ptr<gui::MultilineTextBoxStyle> *)in_RDI);
    std::shared_ptr<gui::MultilineTextBoxStyle>::~shared_ptr
              ((shared_ptr<gui::MultilineTextBoxStyle> *)0x25af2b);
    *(undefined1 *)(in_RSI + 0x2d0) = 1;
  }
  std::shared_ptr<gui::MultilineTextBoxStyle>::shared_ptr
            ((shared_ptr<gui::MultilineTextBoxStyle> *)this_00,
             (shared_ptr<gui::MultilineTextBoxStyle> *)in_RDI);
  sVar1.super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00;
  return (shared_ptr<gui::MultilineTextBoxStyle>)
         sVar1.super___shared_ptr<gui::MultilineTextBoxStyle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MultilineTextBoxStyle> MultilineTextBox::getStyle() {
    if (!styleCopied_) {
        style_ = style_->clone();
        styleCopied_ = true;
    }
    return style_;
}